

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O3

void __thiscall util_tests::clearshrink_test::test_method(clearshrink_test *this)

{
  pointer puVar1;
  pointer puVar2;
  _Map_pointer ppiVar3;
  _Elt_pointer piVar4;
  long lVar5;
  _Deque_base<int,_std::allocator<int>_> *p_Var6;
  _Deque_base<int,_std::allocator<int>_> *p_Var7;
  iterator in_R8;
  iterator pvVar8;
  iterator in_R9;
  iterator pvVar9;
  long in_FS_OFFSET;
  byte bVar10;
  initializer_list<unsigned_char> __l;
  const_string file;
  const_string file_00;
  initializer_list<bool> __l_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  assertion_result local_1d0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  undefined4 local_16c;
  long local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  undefined4 *local_140;
  lazy_ostream local_138;
  undefined1 *local_128;
  undefined4 **local_120;
  long *local_110;
  char *local_108;
  char *local_100;
  vector<unsigned_char,_std::allocator<unsigned_char>_> v;
  _Deque_base<int,_std::allocator<int>_> local_d8;
  _Deque_base<int,_std::allocator<int>_> local_88;
  long local_38;
  
  bVar10 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)CONCAT53(local_88._M_impl.super__Deque_impl_data._M_map._3_5_,0x30201);
  __l._M_len = 3;
  __l._M_array = (iterator)&local_88;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&v,__l,(allocator_type *)&local_d8);
  puVar2 = v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  puVar1 = v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)puVar2 - (long)puVar1);
  }
  local_150 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x718;
  file.m_begin = (iterator)&local_150;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_160,msg);
  local_138._8_8_ = local_138._8_8_ & 0xffffffffffffff00;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_168 = (long)v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
  local_120 = (undefined4 **)0xf4aea1;
  local_110 = &local_168;
  local_140 = &local_16c;
  local_16c = 0;
  local_1d0.m_message.px = (element_type *)0x0;
  local_1d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_100 = "";
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)&local_110;
  local_88._M_impl.super__Deque_impl_data._M_map_size =
       local_88._M_impl.super__Deque_impl_data._M_map_size & 0xffffffffffffff00;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&PTR__lazy_ostream_01388f48;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
       (_Elt_pointer)boost::unit_test::lazy_ostream::inst;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)&local_140;
  local_d8._M_impl.super__Deque_impl_data._M_map_size =
       local_d8._M_impl.super__Deque_impl_data._M_map_size & 0xffffffffffffff00;
  local_d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&PTR__lazy_ostream_013890c8;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_cur =
       (_Elt_pointer)boost::unit_test::lazy_ostream::inst;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_1d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_168 == 0);
  boost::test_tools::tt_detail::report_assertion
            (&local_1d0,&local_138,1,2,REQUIRE,0xf4a64b,(size_t)&local_108,0x718,&local_88,"0",
             (allocator_type *)&local_d8);
  boost::detail::shared_count::~shared_count(&local_1d0.m_message.pn);
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x719;
  file_00.m_begin = (iterator)&local_180;
  msg_00.m_end = pvVar9;
  msg_00.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_190,
             msg_00);
  local_138._8_8_ = local_138._8_8_ & 0xffffffffffffff00;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = (undefined4 **)0xf4aea1;
  local_168 = (long)v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage -
              (long)v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
  local_1d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_168 == 0);
  local_16c = 0;
  local_1d0.m_message.px = (element_type *)0x0;
  local_1d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_100 = "";
  local_110 = &local_168;
  local_88._M_impl.super__Deque_impl_data._M_map_size =
       local_88._M_impl.super__Deque_impl_data._M_map_size & 0xffffffffffffff00;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&PTR__lazy_ostream_01388f48;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
       (_Elt_pointer)boost::unit_test::lazy_ostream::inst;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)&local_110;
  local_140 = &local_16c;
  local_d8._M_impl.super__Deque_impl_data._M_map_size =
       local_d8._M_impl.super__Deque_impl_data._M_map_size & 0xffffffffffffff00;
  local_d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&PTR__lazy_ostream_013890c8;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_cur =
       (_Elt_pointer)boost::unit_test::lazy_ostream::inst;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)&local_140;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1d0,&local_138,1,2,REQUIRE,0xf525eb,(size_t)&local_108,0x719,&local_88,"0",
             (allocator_type *)&local_d8);
  boost::detail::shared_count::~shared_count(&local_1d0.m_message.pn);
  if (v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_d8._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)CONCAT26(local_d8._M_impl.super__Deque_impl_data._M_map._6_2_,0x10100000100);
  __l_00._M_len = 6;
  __l_00._M_array = (iterator)&local_d8;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_88,__l_00,(allocator_type *)&local_138);
  piVar4 = local_88._M_impl.super__Deque_impl_data._M_start._M_last;
  ppiVar3 = local_88._M_impl.super__Deque_impl_data._M_map;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  if (ppiVar3 != (_Map_pointer)0x0) {
    operator_delete(ppiVar3,(long)piVar4 - (long)ppiVar3);
  }
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x71f;
  file_01.m_begin = (iterator)&local_1a0;
  msg_01.m_end = pvVar9;
  msg_01.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1b0,
             msg_01);
  local_1d0.m_message.px = (element_type *)((ulong)local_1d0.m_message.px & 0xffffffffffffff00);
  local_1d0._0_8_ = &PTR__lazy_ostream_01388f08;
  local_1d0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1b8 = "";
  local_168 = ((long)local_88._M_impl.super__Deque_impl_data._M_start._M_cur -
              (long)local_88._M_impl.super__Deque_impl_data._M_map) * 8 +
              ((ulong)local_88._M_impl.super__Deque_impl_data._M_start._M_first & 0xffffffff);
  v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                         .super__Vector_impl_data._M_start._1_7_,local_168 == 0);
  local_16c = 0;
  v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_100 = "";
  local_110 = &local_168;
  local_d8._M_impl.super__Deque_impl_data._M_map_size =
       local_d8._M_impl.super__Deque_impl_data._M_map_size & 0xffffffffffffff00;
  local_d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&PTR__lazy_ostream_01388f48;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_cur =
       (_Elt_pointer)boost::unit_test::lazy_ostream::inst;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)&local_110;
  local_140 = &local_16c;
  local_138._8_8_ = local_138._8_8_ & 0xffffffffffffff00;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013890c8;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = &local_140;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&v,(lazy_ostream *)&local_1d0,1,2,REQUIRE,0xf4a64b,
             (size_t)&local_108,0x71f,&local_d8,"0",&local_138);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_1e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x720;
  file_02.m_begin = (iterator)&local_1e0;
  msg_02.m_end = pvVar9;
  msg_02.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1f0,
             msg_02);
  local_168 = ((long)local_88._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)local_88._M_impl.super__Deque_impl_data._M_map) * 8;
  local_1d0.m_message.px = (element_type *)((ulong)local_1d0.m_message.px & 0xffffffffffffff00);
  local_1d0._0_8_ = &PTR__lazy_ostream_01388f08;
  local_1d0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1b8 = "";
  v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                         .super__Vector_impl_data._M_start._1_7_,
                         (_Map_pointer)local_88._M_impl.super__Deque_impl_data._M_start._M_last ==
                         local_88._M_impl.super__Deque_impl_data._M_map);
  local_16c = 0;
  v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_100 = "";
  local_110 = &local_168;
  local_d8._M_impl.super__Deque_impl_data._M_map_size =
       local_d8._M_impl.super__Deque_impl_data._M_map_size & 0xffffffffffffff00;
  local_d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&PTR__lazy_ostream_01388f48;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_cur =
       (_Elt_pointer)boost::unit_test::lazy_ostream::inst;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)&local_110;
  local_140 = &local_16c;
  local_138._8_8_ = local_138._8_8_ & 0xffffffffffffff00;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013890c8;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = &local_140;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&v,(lazy_ostream *)&local_1d0,1,2,REQUIRE,0xf525eb,
             (size_t)&local_108,0x720,&local_d8,"0",&local_138);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if (local_88._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0) {
    operator_delete(local_88._M_impl.super__Deque_impl_data._M_map,
                    (long)local_88._M_impl.super__Deque_impl_data._M_start._M_last -
                    (long)local_88._M_impl.super__Deque_impl_data._M_map);
  }
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x300000001;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0x700000003;
  local_d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::deque<int,std::allocator<int>>::_M_range_initialize<int_const*>();
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_88,0);
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_node =
       local_88._M_impl.super__Deque_impl_data._M_finish._M_node;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_last =
       local_88._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_first =
       local_88._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
       local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_node =
       local_88._M_impl.super__Deque_impl_data._M_start._M_node;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_last =
       local_88._M_impl.super__Deque_impl_data._M_start._M_last;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_first =
       local_88._M_impl.super__Deque_impl_data._M_start._M_first;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_cur =
       local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_d8._M_impl.super__Deque_impl_data._M_map_size =
       local_88._M_impl.super__Deque_impl_data._M_map_size;
  local_d8._M_impl.super__Deque_impl_data._M_map = local_88._M_impl.super__Deque_impl_data._M_map;
  local_138._vptr_lazy_ostream = (_func_int **)local_88._M_impl.super__Deque_impl_data._M_map;
  local_138._8_8_ = local_88._M_impl.super__Deque_impl_data._M_map_size;
  p_Var6 = &local_d8;
  p_Var7 = &local_88;
  for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
    (p_Var7->_M_impl).super__Deque_impl_data._M_map =
         (p_Var6->_M_impl).super__Deque_impl_data._M_map;
    p_Var6 = (_Deque_base<int,_std::allocator<int>_> *)((long)p_Var6 + ((ulong)bVar10 * -2 + 1) * 8)
    ;
    p_Var7 = (_Deque_base<int,_std::allocator<int>_> *)((long)p_Var7 + ((ulong)bVar10 * -2 + 1) * 8)
    ;
  }
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_88);
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x726;
  file_03.m_begin = (iterator)&local_200;
  msg_03.m_end = pvVar9;
  msg_03.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_210,
             msg_03);
  local_1d0.m_message.px = (element_type *)((ulong)local_1d0.m_message.px & 0xffffffffffffff00);
  local_1d0._0_8_ = &PTR__lazy_ostream_01388f08;
  local_1d0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1b8 = "";
  local_168 = ((long)local_d8._M_impl.super__Deque_impl_data._M_start._M_last -
               (long)local_d8._M_impl.super__Deque_impl_data._M_start._M_cur >> 2) +
              ((long)local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur -
               (long)local_d8._M_impl.super__Deque_impl_data._M_finish._M_first >> 2) +
              ((((ulong)((long)local_d8._M_impl.super__Deque_impl_data._M_finish._M_node -
                        (long)local_d8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
              (ulong)(local_d8._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0
                     )) * 0x80;
  v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                         .super__Vector_impl_data._M_start._1_7_,local_168 == 0);
  local_16c = 0;
  v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_100 = "";
  local_110 = &local_168;
  local_88._M_impl.super__Deque_impl_data._M_map_size =
       local_88._M_impl.super__Deque_impl_data._M_map_size & 0xffffffffffffff00;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&PTR__lazy_ostream_01388f48;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
       (_Elt_pointer)boost::unit_test::lazy_ostream::inst;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)&local_110;
  local_140 = &local_16c;
  local_138._8_8_ = local_138._8_8_ & 0xffffffffffffff00;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013890c8;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = &local_140;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&v,(lazy_ostream *)&local_1d0,1,2,REQUIRE,0xf4a64b,
             (size_t)&local_108,0x726,&local_88,"0",&local_138);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_d8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(clearshrink_test)
{
    {
        std::vector<uint8_t> v = {1, 2, 3};
        ClearShrink(v);
        BOOST_CHECK_EQUAL(v.size(), 0);
        BOOST_CHECK_EQUAL(v.capacity(), 0);
    }

    {
        std::vector<bool> v = {false, true, false, false, true, true};
        ClearShrink(v);
        BOOST_CHECK_EQUAL(v.size(), 0);
        BOOST_CHECK_EQUAL(v.capacity(), 0);
    }

    {
        std::deque<int> v = {1, 3, 3, 7};
        ClearShrink(v);
        BOOST_CHECK_EQUAL(v.size(), 0);
        // std::deque has no capacity() we can observe.
    }
}